

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O3

void __thiscall wasm::I64ToI32Lowering::visitFunction(I64ToI32Lowering *this,Function *func)

{
  Builder *this_00;
  char *pcVar1;
  undefined4 uVar2;
  uint uVar3;
  uint uVar4;
  iterator iVar5;
  LocalSet *any;
  Expression *pEVar6;
  GlobalSet *this_01;
  Block *pBVar7;
  size_t sVar8;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Type>,_std::allocator<std::pair<const_unsigned_int,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_02;
  long *plVar9;
  mapped_type *pmVar10;
  ulong uVar11;
  long *plVar12;
  uint __len;
  Type TVar13;
  uint __val;
  Name name;
  Signature SVar14;
  Signature SVar15;
  string_view sVar16;
  undefined1 local_78 [8];
  TempVar lowBits;
  TempVar highBits;
  
  if ((func->super_Importable).module.super_IString.str._M_str == (char *)0x0) {
    highBits.ty.id = (uintptr_t)this;
    SVar14 = HeapType::getSignature(&func->type);
    if (SVar14.results.id.id == 3) {
      SVar15 = HeapType::getSignature(&func->type);
      SVar14.results.id = 2;
      SVar14.params.id = SVar15.params.id.id;
      HeapType::HeapType((HeapType *)&lowBits.ty,SVar14);
      (func->type).id = lowBits.ty.id;
      lowBits.ty.id = (uintptr_t)func->body;
      iVar5 = std::
              _Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find((_Hashtable<wasm::Expression_*,_std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Expression_*>,_std::hash<wasm::Expression_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      *)(highBits.ty.id + 0x1a8),(key_type *)&lowBits.ty);
      TVar13 = highBits.ty;
      if (iVar5.
          super__Node_iterator_base<std::pair<wasm::Expression_*const,_wasm::I64ToI32Lowering::TempVar>,_false>
          ._M_cur != (__node_type *)0x0) {
        fetchOutParam((TempVar *)&lowBits.ty,(I64ToI32Lowering *)highBits.ty.id,func->body);
        getTemp((TempVar *)local_78,(I64ToI32Lowering *)TVar13.id,(Type)0x2);
        if ((char)lowBits.pass == '\x01') {
LAB_008d1b80:
          __assert_fail("!moved",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                        ,0x4f,"Index wasm::I64ToI32Lowering::TempVar::operator unsigned int()");
        }
        any = Builder::makeLocalSet(*(Builder **)(highBits.ty.id + 0x130),local_78._0_4_,func->body)
        ;
        pcVar1 = DAT_010b1008;
        sVar8 = INT64_TO_32_HIGH_BITS;
        if ((char)highBits.pass == '\x01') goto LAB_008d1b80;
        plVar9 = *(long **)(highBits.ty.id + 0x130);
        uVar2 = (undefined4)lowBits.ty.id;
        pEVar6 = (Expression *)MixedArena::allocSpace((MixedArena *)(*plVar9 + 0x200),0x18,8);
        pEVar6->_id = LocalGetId;
        *(undefined4 *)(pEVar6 + 1) = uVar2;
        (pEVar6->type).id = 2;
        this_01 = (GlobalSet *)MixedArena::allocSpace((MixedArena *)(*plVar9 + 0x200),0x28,8);
        (this_01->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression._id =
             GlobalSetId;
        (this_01->super_SpecificExpression<(wasm::Expression::Id)11>).super_Expression.type.id = 0;
        (this_01->name).super_IString.str._M_len = sVar8;
        (this_01->name).super_IString.str._M_str = pcVar1;
        this_01->value = pEVar6;
        GlobalSet::finalize(this_01);
        if ((char)lowBits.pass == '\x01') goto LAB_008d1b80;
        pEVar6 = (Expression *)
                 MixedArena::allocSpace
                           ((MixedArena *)(**(long **)(highBits.ty.id + 0x130) + 0x200),0x18,8);
        pEVar6->_id = LocalGetId;
        *(undefined4 *)(pEVar6 + 1) = local_78._0_4_;
        (pEVar6->type).id = 2;
        this_00 = *(Builder **)(highBits.ty.id + 0x130);
        pBVar7 = Builder::blockify(this_00,(Expression *)any,(Expression *)this_01);
        pBVar7 = Builder::blockify(this_00,(Expression *)pBVar7,pEVar6);
        func->body = (Expression *)pBVar7;
        TempVar::~TempVar((TempVar *)local_78);
        TempVar::~TempVar((TempVar *)&lowBits.ty);
      }
    }
    sVar8 = Function::getNumLocals(func);
    if (sVar8 < *(uint *)(highBits.ty.id + 0x250)) {
      this_02 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Type>,_std::allocator<std::pair<const_unsigned_int,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 *)(highBits.ty.id + 0x1e0);
      __val = 0;
      do {
        __len = 1;
        if (9 < __val) {
          uVar11 = (ulong)__val;
          uVar3 = 4;
          do {
            __len = uVar3;
            uVar4 = (uint)uVar11;
            if (uVar4 < 100) {
              __len = __len - 2;
              goto LAB_008d1a65;
            }
            if (uVar4 < 1000) {
              __len = __len - 1;
              goto LAB_008d1a65;
            }
            if (uVar4 < 10000) goto LAB_008d1a65;
            uVar11 = uVar11 / 10000;
            uVar3 = __len + 4;
          } while (99999 < uVar4);
          __len = __len + 1;
        }
LAB_008d1a65:
        local_78 = (undefined1  [8])&lowBits.pass;
        std::__cxx11::string::_M_construct((ulong)local_78,(char)__len);
        std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_78,__len,__val);
        TVar13.id = 0xd;
        plVar9 = (long *)std::__cxx11::string::replace((ulong)local_78,0,(char *)0x0,0xde21a1);
        plVar12 = plVar9 + 2;
        if ((long *)*plVar9 == plVar12) {
          highBits.pass = (I64ToI32Lowering *)*plVar12;
          highBits._16_8_ = plVar9[3];
          lowBits.ty.id = (uintptr_t)&highBits.pass;
        }
        else {
          highBits.pass = (I64ToI32Lowering *)*plVar12;
          lowBits.ty.id = (uintptr_t)*plVar9;
        }
        highBits._0_8_ = plVar9[1];
        *plVar9 = (long)plVar12;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        sVar16._M_str = (char *)0x0;
        sVar16._M_len = lowBits.ty.id;
        sVar16 = IString::interned((IString *)highBits._0_8_,sVar16,SUB81(plVar12,0));
        name.super_IString.str._M_len = sVar16._M_str;
        if ((I64ToI32Lowering **)lowBits.ty.id != &highBits.pass) {
          operator_delete((void *)lowBits.ty.id,
                          (ulong)((long)&((highBits.pass)->
                                         super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                                         ).super_Pass._vptr_Pass + 1));
        }
        if (local_78 != (undefined1  [8])&lowBits.pass) {
          operator_delete((void *)local_78,CONCAT71(lowBits.pass._1_7_,(char)lowBits.pass) + 1);
        }
        __val = __val + 1;
        lowBits.ty.id._0_4_ = (int)sVar8;
        pmVar10 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Type>,_std::allocator<std::pair<const_unsigned_int,_wasm::Type>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[](this_02,(key_type *)&lowBits.ty);
        name.super_IString.str._M_str = (char *)pmVar10->id;
        Builder::addVar((Builder *)func,(Function *)sVar16._M_len,name,TVar13);
        sVar8 = sVar8 + 1;
      } while (sVar8 < *(uint *)(highBits.ty.id + 0x250));
    }
  }
  return;
}

Assistant:

void visitFunction(Function* func) {
    if (func->imported()) {
      return;
    }
    if (func->getResults() == Type::i64) {
      func->setResults(Type::i32);
      // body may not have out param if it ends with control flow
      if (hasOutParam(func->body)) {
        TempVar highBits = fetchOutParam(func->body);
        TempVar lowBits = getTemp();
        LocalSet* setLow = builder->makeLocalSet(lowBits, func->body);
        GlobalSet* setHigh = builder->makeGlobalSet(
          INT64_TO_32_HIGH_BITS, builder->makeLocalGet(highBits, Type::i32));
        LocalGet* getLow = builder->makeLocalGet(lowBits, Type::i32);
        func->body = builder->blockify(setLow, setHigh, getLow);
      }
    }
    int idx = 0;
    for (size_t i = func->getNumLocals(); i < nextTemp; i++) {
      Name tmpName("i64toi32_i32$" + std::to_string(idx++));
      builder->addVar(func, tmpName, tempTypes[i]);
    }
  }